

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_test.cc
# Opt level: O0

void __thiscall wiener_highbd::WienerTestHighbd::~WienerTestHighbd(WienerTestHighbd *this)

{
  ~WienerTestHighbd((WienerTestHighbd *)&this[-1].dgd_buf);
  return;
}

Assistant:

void SetUp() override {
    src_buf = (uint16_t *)aom_memalign(
        32, MAX_DATA_BLOCK * MAX_DATA_BLOCK * sizeof(*src_buf));
    ASSERT_NE(src_buf, nullptr);
    dgd_buf = (uint16_t *)aom_memalign(
        32, MAX_DATA_BLOCK * MAX_DATA_BLOCK * sizeof(*dgd_buf));
    ASSERT_NE(dgd_buf, nullptr);
    const size_t buf_size =
        sizeof(*buf) * 6 * RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    buf = (int16_t *)aom_memalign(32, buf_size);
    ASSERT_NE(buf, nullptr);
    memset(buf, 0, buf_size);
    target_func_ = GET_PARAM(0);
  }